

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O0

void __thiscall VkSpecParser::skip(VkSpecParser *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  QStringView *in_RDI;
  long in_FS_OFFSET;
  QString tag;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 uVar4;
  QStringView *str;
  QStringView *in_stack_ffffffffffffffb0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  str = in_RDI;
  QXmlStreamReader::name();
  QStringView::toString(in_RDI);
  do {
    bVar2 = QXmlStreamReader::atEnd();
    if (((bVar2 ^ 0xff) & 1) == 0) break;
    QXmlStreamReader::readNext();
    bVar3 = QXmlStreamReader::isEndElement((QXmlStreamReader *)0x103aed);
    uVar4 = false;
    if (bVar3) {
      QXmlStreamReader::name();
      QStringView::QStringView<QString,_true>(in_stack_ffffffffffffffb0,(QString *)str);
      uVar4 = operator==(in_RDI,(QStringView *)CONCAT17(uVar4,in_stack_ffffffffffffff98));
    }
  } while ((bool)uVar4 == false);
  QString::~QString((QString *)0x103b51);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void VkSpecParser::skip()
{
    QString tag = m_reader.name().toString();
    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == tag)
            break;
    }
}